

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Declaration_Type.cpp
# Opt level: O0

ostream * psy::C::operator<<(ostream *os,TypeDeclarationSymbol *tyDecl)

{
  TypeDeclarationCategory TVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar3;
  TypeDeclarationSymbol *tyDecl_local;
  ostream *os_local;
  
  if (tyDecl == (TypeDeclarationSymbol *)0x0) {
    os_local = std::operator<<(os,"<TypeDeclaration is null>");
  }
  else {
    TVar1 = TypeDeclarationSymbol::category(tyDecl);
    if (TVar1 == Tag) {
      iVar2 = (*(tyDecl->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x19])();
      os_local = operator<<(os,(TagDeclarationSymbol *)CONCAT44(extraout_var,iVar2));
    }
    else if (TVar1 == Typedef) {
      iVar2 = (*(tyDecl->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x23])();
      os_local = operator<<(os,(TypedefDeclarationSymbol *)CONCAT44(extraout_var_00,iVar2));
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/symbols/Declaration_Type.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4c);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,"<empty message>");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      os_local = std::operator<<(os,"<invalid TypeDeclaration>");
    }
  }
  return os_local;
}

Assistant:

PSY_C_API std::ostream& operator<<(std::ostream& os, const TypeDeclarationSymbol* tyDecl)
{
    if (!tyDecl)
        return os << "<TypeDeclaration is null>";
    switch (tyDecl->category()) {
        case TypeDeclarationCategory::Tag:
            return os << tyDecl->asTagTypeDeclaration();
        case TypeDeclarationCategory::Typedef:
            return os << tyDecl->asTypedefDeclaration();
    }
    PSY_ASSERT_1(false);
    return os << "<invalid TypeDeclaration>";
}